

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserCreateView.cpp
# Opt level: O1

void __thiscall UserCreateView::display(UserCreateView *this)

{
  _func_int **pp_Var1;
  long lVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  UserCreateUpdateForm *this_00;
  undefined4 extraout_var;
  long *plVar6;
  Controller *this_01;
  View *pVVar7;
  long *plVar8;
  string lastName;
  string firstName;
  string password;
  string email;
  BaseUser user;
  long *local_200;
  long local_1f0;
  long lStack_1e8;
  string local_1e0;
  string local_1c0;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  string local_180;
  string local_160;
  string local_140;
  undefined1 local_120 [240];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To create a new user fill in the details asked below: \n",0x37);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  local_1e0._M_string_length = 0;
  local_1e0.field_2._M_local_buf[0] = '\0';
  local_160._M_string_length = 0;
  local_160.field_2._M_local_buf[0] = '\0';
  local_180._M_string_length = 0;
  local_180.field_2._M_local_buf[0] = '\0';
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First name: ",0xc);
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_1c0,(string *)local_120);
  pp_Var1 = (_func_int **)(local_120 + 0x10);
  if ((_func_int **)local_120._0_8_ != pp_Var1) {
    operator_delete((void *)local_120._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Last name: ",0xb);
  Input::getString_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_1e0,(string *)local_120);
  if ((_func_int **)local_120._0_8_ != pp_Var1) {
    operator_delete((void *)local_120._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Email: ",7);
  Input::getEmail_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_160,(string *)local_120);
  if ((_func_int **)local_120._0_8_ != pp_Var1) {
    operator_delete((void *)local_120._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Password: ",10);
  Input::getPassword_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&local_180,(string *)local_120);
  if ((_func_int **)local_120._0_8_ != pp_Var1) {
    operator_delete((void *)local_120._0_8_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Should this user be an admin? (y/n): ",0x25);
  cVar3 = Input::getChar();
  this_00 = (UserCreateUpdateForm *)operator_new(0xb0);
  UserCreateUpdateForm::UserCreateUpdateForm
            (this_00,&local_1c0,&local_1e0,&local_160,&local_180,cVar3 == 'y',(BaseUser *)0x0);
  (this->super_CreateView<BaseUser>).form = (ModelForm<BaseUser> *)this_00;
  bVar4 = Form::isValid((Form *)this_00);
  if (bVar4) {
    iVar5 = (*(((this->super_CreateView<BaseUser>).form)->super_Form)._vptr_Form[1])();
    local_120._8_4_ = *(int *)(CONCAT44(extraout_var,iVar5) + 8);
    local_120._0_8_ = &PTR_save_0012dc18;
    memcpy(local_120 + 0xc,(void *)(CONCAT44(extraout_var,iVar5) + 0xc),0xe1);
    BaseUser::getFullName_abi_cxx11_(&local_140,(BaseUser *)local_120);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_140,0,(char *)0x0,0x121271);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_190 = *plVar8;
      lStack_188 = plVar6[3];
      local_1a0 = &local_190;
    }
    else {
      local_190 = *plVar8;
      local_1a0 = (long *)*plVar6;
    }
    local_198 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    plVar8 = plVar6 + 2;
    if ((long *)*plVar6 == plVar8) {
      local_1f0 = *plVar8;
      lStack_1e8 = plVar6[3];
      local_200 = &local_1f0;
    }
    else {
      local_1f0 = *plVar8;
      local_200 = (long *)*plVar6;
    }
    lVar2 = plVar6[1];
    *plVar6 = (long)plVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(char *)local_200,lVar2);
    if (local_200 != &local_1f0) {
      operator_delete(local_200);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p);
    }
  }
  else {
    Form::printErrors(&((this->super_CreateView<BaseUser>).form)->super_Form);
  }
  this_01 = Controller::getInstance();
  local_120._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"admin-panel","");
  pVVar7 = Controller::getView(this_01,(string *)local_120);
  View::response->view = pVVar7;
  if ((_func_int **)local_120._0_8_ != pp_Var1) {
    operator_delete((void *)local_120._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void UserCreateView::display() {
    cout << "To create a new user fill in the details asked below: \n";
    string firstName, lastName, email, password;
    bool adminStatus;
    cout << "First name: ";
    firstName = Input::getString();
    cout << "Last name: ";
    lastName = Input::getString();
    cout << "Email: ";
    email = Input::getEmail();
    cout << "Password: ";
    password = Input::getPassword();
    cout << "Should this user be an admin? (y/n): ";
    adminStatus = (Input::getChar() == 'y');
    form = new UserCreateUpdateForm(firstName, lastName, email, password, adminStatus);
    if (form->isValid()) {
        BaseUser user = form->save();
        cout << "New user, " + user.getFullName() + " saved successfully.\n";
    } else {
        form->printErrors();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}